

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopDescriptor::PopulateList(LoopDescriptor *this,IRContext *context,Function *f)

{
  DominatorTree *pDVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  reference this_00;
  Instruction *this_01;
  CFG *pCVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  reference puVar7;
  BasicBlock *merge_target;
  BasicBlock *pBVar8;
  BasicBlock *header;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  this_03;
  reference ppLVar9;
  reference ppLVar10;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *in_RCX;
  BasicBlock *end;
  pair<unsigned_int,_spvtools::opt::Loop_*> pVar11;
  Loop *local_540;
  Loop *loop;
  iterator __end2_1;
  iterator __begin2_1;
  LoopContainerType *__range2_1;
  uint32_t local_50c;
  pair<unsigned_int,_spvtools::opt::Loop_*> local_508;
  reference local_4f8;
  DominatorTreeNode *loop_node;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> __end4_1;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> __begin4_1;
  df_iterator local_3e8;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_> local_390;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_> *local_2e0;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_> *__range4_1;
  DominatorTreeNode *dom_merge_node;
  Loop *previous_loop;
  reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
  itr;
  Loop *current_loop;
  BasicBlock *header_bb;
  BasicBlock *continue_bb;
  BasicBlock *merge_bb;
  uint32_t continue_bb_id;
  uint32_t merge_bb_id;
  uint32_t pid;
  const_iterator __end4;
  const_iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  bool all_backedge_unreachable;
  Instruction *merge_inst;
  DominatorTreeNode *node;
  undefined1 local_248 [8];
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> __end2;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> __begin2;
  post_iterator local_140;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_> local_e8;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_> *local_38
  ;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_> *__range2
  ;
  DominatorTree *dom_tree;
  DominatorAnalysis *dom_analysis;
  Function *f_local;
  IRContext *context_local;
  LoopDescriptor *this_local;
  
  dom_analysis = (DominatorAnalysis *)f;
  f_local = (Function *)context;
  context_local = (IRContext *)this;
  dom_tree = (DominatorTree *)IRContext::GetDominatorAnalysis(context,f);
  ClearLoops(this);
  __range2 = (IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>
              *)DominatorAnalysisBase::GetDomTree((DominatorAnalysisBase *)dom_tree);
  DominatorTree::post_begin(&local_140,(DominatorTree *)__range2);
  DominatorTree::post_end
            ((post_iterator *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),(DominatorTree *)__range2);
  make_range<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>>
            (&local_e8,(opt *)&local_140,
             (PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),in_RCX);
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::~PostOrderTreeDFIterator
            ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
             ((long)&__begin2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::~PostOrderTreeDFIterator(&local_140);
  local_38 = &local_e8;
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>::begin
            ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
             ((long)&__end2.parent_iterators_.c.
                     super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),local_38);
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>::end
            ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)local_248,local_38);
  do {
    bVar2 = PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::operator!=
                      ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                       ((long)&__end2.parent_iterators_.c.
                               super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                       (PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)local_248);
    if (!bVar2) {
      PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::~PostOrderTreeDFIterator
                ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)local_248);
      PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::~PostOrderTreeDFIterator
                ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                 ((long)&__end2.parent_iterators_.c.
                         super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>::
      ~IteratorRange(&local_e8);
      __end2_1 = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                           (&this->loops_);
      loop = (Loop *)std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::end
                               (&this->loops_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                                 *)&loop), bVar2) {
        ppLVar10 = __gnu_cxx::
                   __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                   ::operator*(&__end2_1);
        local_540 = *ppLVar10;
        bVar2 = Loop::HasParent(local_540);
        if (!bVar2) {
          std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                    (&(this->placeholder_top_loop_).nested_loops_,&local_540);
        }
        __gnu_cxx::
        __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
        ::operator++(&__end2_1);
      }
      return;
    }
    this_00 = PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::operator*
                        ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                         ((long)&__end2.parent_iterators_.c.
                                 super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    this_01 = BasicBlock::GetLoopMergeInst(this_00->bb_);
    if (this_01 != (Instruction *)0x0) {
      bVar2 = true;
      pCVar6 = IRContext::cfg((IRContext *)f_local);
      uVar4 = BasicBlock::id(this_00->bb_);
      this_02 = CFG::preds(pCVar6,uVar4);
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_02);
      _merge_bb_id = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_02);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                         *)&merge_bb_id), bVar3) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        uVar4 = *puVar7;
        bVar3 = DominatorAnalysisBase::IsReachable((DominatorAnalysisBase *)dom_tree,uVar4);
        pDVar1 = dom_tree;
        if (bVar3) {
          uVar5 = BasicBlock::id(this_00->bb_);
          bVar3 = DominatorAnalysisBase::Dominates((DominatorAnalysisBase *)pDVar1,uVar5,uVar4);
          if (bVar3) {
            bVar2 = false;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      if (!bVar2) {
        uVar4 = Instruction::GetSingleWordOperand(this_01,0);
        uVar5 = Instruction::GetSingleWordOperand(this_01,1);
        pCVar6 = IRContext::cfg((IRContext *)f_local);
        merge_target = CFG::block(pCVar6,uVar4);
        pCVar6 = IRContext::cfg((IRContext *)f_local);
        pBVar8 = CFG::block(pCVar6,uVar5);
        header = IRContext::get_instr_block((IRContext *)f_local,this_01);
        this_03._M_current = (Loop **)operator_new(0x90);
        end = header;
        Loop::Loop((Loop *)this_03._M_current,(IRContext *)f_local,(DominatorAnalysis *)dom_tree,
                   header,pBVar8,merge_target);
        itr.current._M_current =
             (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
              )(__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                )this_03._M_current;
        std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                  (&this->loops_,(value_type *)&itr);
        std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::rbegin
                  ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                   &stack0xfffffffffffffd40);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
        ::operator+((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                     *)&stack0xfffffffffffffd48,(difference_type)&stack0xfffffffffffffd40);
        while( true ) {
          std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::rend
                    ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                     &previous_loop);
          bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                                   *)&stack0xfffffffffffffd48,
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                                   *)&previous_loop);
          if (!bVar2) break;
          ppLVar9 = std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                                 *)&stack0xfffffffffffffd48);
          dom_merge_node = (DominatorTreeNode *)*ppLVar9;
          bVar2 = Loop::HasParent((Loop *)dom_merge_node);
          pDVar1 = dom_tree;
          if (!bVar2) {
            pBVar8 = Loop::GetHeaderBlock((Loop *)dom_merge_node);
            bVar2 = DominatorAnalysisBase::Dominates((DominatorAnalysisBase *)pDVar1,header,pBVar8);
            pDVar1 = dom_tree;
            if (bVar2) {
              pBVar8 = Loop::GetHeaderBlock((Loop *)dom_merge_node);
              bVar2 = DominatorAnalysisBase::Dominates
                                ((DominatorAnalysisBase *)pDVar1,merge_target,pBVar8);
              if (!bVar2) {
                Loop::AddNestedLoop((Loop *)itr.current._M_current,(Loop *)dom_merge_node);
              }
            }
          }
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>_>
                        *)&stack0xfffffffffffffd48);
        }
        __range4_1 = (IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_>
                      *)DominatorTree::GetTreeNode((DominatorTree *)__range2,merge_target);
        DominatorTreeNode::df_begin(&local_3e8,this_00);
        DominatorTreeNode::df_end
                  ((df_iterator *)
                   ((long)&__begin4_1.parent_iterators_.c.
                           super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18),this_00);
        make_range<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>>
                  (&local_390,(opt *)&local_3e8,
                   (TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                   ((long)&__begin4_1.parent_iterators_.c.
                           super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                   (TreeDFIterator<spvtools::opt::DominatorTreeNode> *)end);
        TreeDFIterator<spvtools::opt::DominatorTreeNode>::~TreeDFIterator
                  ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                   ((long)&__begin4_1.parent_iterators_.c.
                           super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        TreeDFIterator<spvtools::opt::DominatorTreeNode>::~TreeDFIterator(&local_3e8);
        local_2e0 = &local_390;
        IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_>::begin
                  ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                   ((long)&__end4_1.parent_iterators_.c.
                           super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18),local_2e0);
        IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_>::end
                  ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)&loop_node,local_2e0);
        while (bVar2 = TreeDFIterator<spvtools::opt::DominatorTreeNode>::operator!=
                                 ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                                  ((long)&__end4_1.parent_iterators_.c.
                                          super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish + 0x18),
                                  (TreeDFIterator<spvtools::opt::DominatorTreeNode> *)&loop_node),
              bVar2) {
          local_4f8 = TreeDFIterator<spvtools::opt::DominatorTreeNode>::operator*
                                ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                                 ((long)&__end4_1.parent_iterators_.c.
                                         super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish + 0x18));
          bVar2 = DominatorTree::Dominates
                            ((DominatorTree *)__range2,(DominatorTreeNode *)__range4_1,local_4f8);
          if (!bVar2) {
            Loop::AddBasicBlock((Loop *)itr.current._M_current,local_4f8->bb_);
            local_50c = BasicBlock::id(local_4f8->bb_);
            pVar11 = std::make_pair<unsigned_int,spvtools::opt::Loop*&>(&local_50c,(Loop **)&itr);
            local_508.second = pVar11.second;
            local_508.first = pVar11.first;
            std::
            unordered_map<unsigned_int,spvtools::opt::Loop*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>>
            ::insert<std::pair<unsigned_int,spvtools::opt::Loop*>>
                      ((unordered_map<unsigned_int,spvtools::opt::Loop*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>>
                        *)&this->basic_block_to_loop_,&local_508);
          }
          TreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++
                    ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                     ((long)&__end4_1.parent_iterators_.c.
                             super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        }
        TreeDFIterator<spvtools::opt::DominatorTreeNode>::~TreeDFIterator
                  ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)&loop_node);
        TreeDFIterator<spvtools::opt::DominatorTreeNode>::~TreeDFIterator
                  ((TreeDFIterator<spvtools::opt::DominatorTreeNode> *)
                   ((long)&__end4_1.parent_iterators_.c.
                           super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_>::
        ~IteratorRange(&local_390);
      }
    }
    PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::operator++
              ((PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)
               ((long)&__end2.parent_iterators_.c.
                       super__Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  } while( true );
}

Assistant:

void LoopDescriptor::PopulateList(IRContext* context, const Function* f) {
  DominatorAnalysis* dom_analysis = context->GetDominatorAnalysis(f);

  ClearLoops();

  // Post-order traversal of the dominator tree to find all the OpLoopMerge
  // instructions.
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  for (DominatorTreeNode& node :
       make_range(dom_tree.post_begin(), dom_tree.post_end())) {
    Instruction* merge_inst = node.bb_->GetLoopMergeInst();
    if (merge_inst) {
      bool all_backedge_unreachable = true;
      for (uint32_t pid : context->cfg()->preds(node.bb_->id())) {
        if (dom_analysis->IsReachable(pid) &&
            dom_analysis->Dominates(node.bb_->id(), pid)) {
          all_backedge_unreachable = false;
          break;
        }
      }
      if (all_backedge_unreachable)
        continue;  // ignore this one, we actually never branch back.

      // The id of the merge basic block of this loop.
      uint32_t merge_bb_id = merge_inst->GetSingleWordOperand(0);

      // The id of the continue basic block of this loop.
      uint32_t continue_bb_id = merge_inst->GetSingleWordOperand(1);

      // The merge target of this loop.
      BasicBlock* merge_bb = context->cfg()->block(merge_bb_id);

      // The continue target of this loop.
      BasicBlock* continue_bb = context->cfg()->block(continue_bb_id);

      // The basic block containing the merge instruction.
      BasicBlock* header_bb = context->get_instr_block(merge_inst);

      // Add the loop to the list of all the loops in the function.
      Loop* current_loop =
          new Loop(context, dom_analysis, header_bb, continue_bb, merge_bb);
      loops_.push_back(current_loop);

      // We have a bottom-up construction, so if this loop has nested-loops,
      // they are by construction at the tail of the loop list.
      for (auto itr = loops_.rbegin() + 1; itr != loops_.rend(); ++itr) {
        Loop* previous_loop = *itr;

        // If the loop already has a parent, then it has been processed.
        if (previous_loop->HasParent()) continue;

        // If the current loop does not dominates the previous loop then it is
        // not nested loop.
        if (!dom_analysis->Dominates(header_bb,
                                     previous_loop->GetHeaderBlock()))
          continue;
        // If the current loop merge dominates the previous loop then it is
        // not nested loop.
        if (dom_analysis->Dominates(merge_bb, previous_loop->GetHeaderBlock()))
          continue;

        current_loop->AddNestedLoop(previous_loop);
      }
      DominatorTreeNode* dom_merge_node = dom_tree.GetTreeNode(merge_bb);
      for (DominatorTreeNode& loop_node :
           make_range(node.df_begin(), node.df_end())) {
        // Check if we are in the loop.
        if (dom_tree.Dominates(dom_merge_node, &loop_node)) continue;
        current_loop->AddBasicBlock(loop_node.bb_);
        basic_block_to_loop_.insert(
            std::make_pair(loop_node.bb_->id(), current_loop));
      }
    }
  }
  for (Loop* loop : loops_) {
    if (!loop->HasParent()) placeholder_top_loop_.nested_loops_.push_back(loop);
  }
}